

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetBuffer3i(void)

{
  uint32 name_00;
  ALenum param_00;
  int32 value1_00;
  int32 value2_00;
  int32 value3_00;
  ALint *origvalue1_00;
  ALint *origvalue2_00;
  ALint *origvalue3_00;
  ALint value3;
  ALint value2;
  ALint value1;
  ALint *origvalue3;
  ALint *origvalue2;
  ALint *origvalue1;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    origvalue1_00 = (ALint *)IO_PTR();
    origvalue2_00 = (ALint *)IO_PTR();
    origvalue3_00 = (ALint *)IO_PTR();
    value1_00 = IO_INT32();
    value2_00 = IO_INT32();
    value3_00 = IO_INT32();
    if (io_failure == 0) {
      visit_alGetBuffer3i((CallerInfo *)&param,name_00,param_00,origvalue1_00,origvalue2_00,
                          origvalue3_00,value1_00,value2_00,value3_00);
    }
  }
  return;
}

Assistant:

static void decode_alGetBuffer3i(void)
{
    IO_START(alGetBuffer3i);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    ALint *origvalue1 = (ALint *) IO_PTR();
    ALint *origvalue2 = (ALint *) IO_PTR();
    ALint *origvalue3 = (ALint *) IO_PTR();
    const ALint value1 = IO_INT32();
    const ALint value2 = IO_INT32();
    const ALint value3 = IO_INT32();
    if (!io_failure) visit_alGetBuffer3i(&callerinfo, name, param, origvalue1, origvalue2, origvalue3, value1, value2, value3);
    IO_END();
}